

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O1

bin_mdef_t * bin_mdef_read_text(ps_config_t *config,char *filename)

{
  ph_rc_t **pppVar1;
  int16 *piVar2;
  ciphone_t *pcVar3;
  phone_t *ppVar4;
  int iVar5;
  mdef_t *m;
  bin_mdef_t *m_00;
  char **ppcVar6;
  size_t sVar7;
  mdef_entry_t *pmVar8;
  cd_tree_t *pcVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ph_lc_t *ppVar14;
  uint uVar15;
  long lVar16;
  ph_rc_t *ppVar17;
  ulong uVar18;
  undefined8 uVar19;
  ph_lc_t *ppVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  
  m = mdef_init(filename,1);
  if (m == (mdef_t *)0x0) {
    return (bin_mdef_t *)0x0;
  }
  uVar23 = m->n_sen;
  if ((int)uVar23 < 0x10000) {
    uVar23 = m->n_sseq;
    if ((int)uVar23 < 0x10000) {
      uVar23 = m->n_ciphone;
      if ((int)uVar23 < 0x100) {
        m_00 = (bin_mdef_t *)
               __ckd_calloc__(1,0x78,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                              ,0x5f);
        m_00->refcnt = 1;
        iVar5 = m->n_ciphone;
        m_00->n_ciphone = iVar5;
        m_00->n_phone = m->n_phone;
        m_00->n_emit_state = m->n_emit_state;
        m_00->n_ci_sen = m->n_ci_sen;
        m_00->n_sen = m->n_sen;
        m_00->n_tmat = m->n_tmat;
        m_00->n_sseq = m->n_sseq;
        m_00->sseq = m->sseq;
        m_00->cd2cisen = m->cd2cisen;
        m_00->sen2cimap = m->sen2cimap;
        m_00->n_ctx = 3;
        m_00->sil = (int)m->sil;
        m->sseq = (uint16 **)0x0;
        m->cd2cisen = (int16 *)0x0;
        m->sen2cimap = (int16 *)0x0;
        ppcVar6 = (char **)__ckd_calloc__((long)iVar5,8,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                          ,0x76);
        m_00->ciname = ppcVar6;
        iVar5 = m_00->n_ciphone;
        uVar24 = 0;
        if (0 < (long)iVar5) {
          pcVar3 = m->ciphone;
          lVar12 = 0;
          do {
            sVar7 = strlen(*(char **)((long)&pcVar3->name + lVar12));
            uVar23 = (int)uVar24 + (int)sVar7 + 1;
            uVar24 = (ulong)uVar23;
            lVar12 = lVar12 + 0x10;
          } while ((long)iVar5 * 0x10 != lVar12);
          uVar24 = (ulong)(int)uVar23;
        }
        lVar12 = 1;
        pcVar10 = (char *)__ckd_calloc__(uVar24,1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                         ,0x7a);
        *m_00->ciname = pcVar10;
        strcpy(*m_00->ciname,m->ciphone->name);
        if (1 < m_00->n_ciphone) {
          lVar22 = 8;
          do {
            ppcVar6 = m_00->ciname;
            pcVar10 = *(char **)((long)ppcVar6 + lVar22 + -8);
            sVar7 = strlen(pcVar10);
            *(char **)((long)ppcVar6 + lVar22) = pcVar10 + sVar7 + 1;
            strcpy(*(char **)((long)m_00->ciname + lVar22),
                   *(char **)((long)&m->ciphone->name + lVar22 * 2));
            iVar5 = strcmp(*(char **)((long)m_00->ciname + lVar22 + -8),
                           *(char **)((long)m_00->ciname + lVar22));
            if (0 < iVar5) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                      ,0x83,"Phone names are not in sorted order, sorry.");
              bin_mdef_free(m_00);
              mdef_free(m);
              return (bin_mdef_t *)0x0;
            }
            lVar12 = lVar12 + 1;
            lVar22 = lVar22 + 8;
          } while (lVar12 < m_00->n_ciphone);
        }
        pmVar8 = (mdef_entry_t *)
                 __ckd_calloc__((long)m_00->n_phone,0xc,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                ,0x8b);
        m_00->phone = pmVar8;
        if (0 < m->n_phone) {
          lVar12 = 8;
          lVar22 = 0;
          lVar13 = 0;
          lVar16 = 0;
          do {
            ppVar4 = m->phone;
            pmVar8 = m_00->phone;
            *(undefined4 *)((long)&pmVar8->ssid + lVar13) =
                 *(undefined4 *)((long)&ppVar4->ssid + lVar22);
            *(undefined4 *)((long)&pmVar8->tmat + lVar13) =
                 *(undefined4 *)((long)&ppVar4->tmat + lVar22);
            if (lVar16 < m_00->n_ciphone) {
              *(undefined1 *)((long)&pmVar8->info + lVar13) =
                   *(undefined1 *)((long)&m->ciphone->name + lVar12);
            }
            else {
              *(undefined1 *)((long)&pmVar8->info + lVar13) =
                   *(undefined1 *)((long)&ppVar4->wpos + lVar22);
              *(undefined1 *)((long)&m_00->phone->info + lVar13 + 1) =
                   *(undefined1 *)((long)&m->phone->ci + lVar22);
              *(undefined1 *)((long)&m_00->phone->info + lVar13 + 2) =
                   *(undefined1 *)((long)&m->phone->lc + lVar22);
              *(undefined1 *)((long)&m_00->phone->info + lVar13 + 3) =
                   *(undefined1 *)((long)&m->phone->rc + lVar22);
            }
            lVar16 = lVar16 + 1;
            lVar13 = lVar13 + 0xc;
            lVar22 = lVar22 + 0x14;
            lVar12 = lVar12 + 0x10;
          } while (lVar16 < m->n_phone);
        }
        uVar23 = m->n_ciphone;
        lVar12 = 0;
        uVar21 = 0;
        if (0 < (int)uVar23) {
          uVar21 = uVar23;
        }
        uVar24 = 0;
        uVar11 = 0;
        do {
          uVar15 = (uint)uVar24;
          if (0 < (int)uVar23) {
            uVar18 = 0;
            do {
              for (ppVar14 = m->wpos_ci_lclist[lVar12][uVar18]; ppVar20 = ppVar14,
                  ppVar14 != (ph_lc_t *)0x0; ppVar14 = ppVar14->next) {
                do {
                  pppVar1 = &ppVar20->rclist;
                  uVar11 = uVar11 + 1;
                  ppVar20 = (ph_lc_t *)*pppVar1;
                } while ((ph_lc_t *)*pppVar1 != (ph_lc_t *)0x0);
                uVar24 = (ulong)((int)uVar24 + 1);
              }
              uVar11 = uVar11 + 1;
              uVar15 = (int)uVar24 + 1;
              uVar24 = (ulong)uVar15;
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar23);
          }
          uVar11 = uVar11 + 1;
          lVar12 = lVar12 + 1;
          uVar24 = (ulong)(uVar15 + 1);
        } while (lVar12 != 4);
        uVar18 = (ulong)(uVar21 * 4 + 4);
        lVar22 = 0;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                ,0xb5,"Allocating %d * %d bytes (%d KiB) for CD tree\n",(ulong)uVar11,8,
                (ulong)(long)(int)uVar11 >> 7 & 0x3fffffffffffff);
        m_00->n_cd_tree = uVar11;
        pcVar9 = (cd_tree_t *)
                 __ckd_calloc__((long)(int)uVar11,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                ,0xb7);
        m_00->cd_tree = pcVar9;
        lVar12 = 4;
        do {
          pcVar9 = m_00->cd_tree;
          pcVar9[lVar22].ctx = (int16)lVar22;
          pcVar9[lVar22].n_down = (int16)m->n_ciphone;
          pcVar9[lVar22].c.pid = (int)lVar12;
          if (0 < m->n_ciphone) {
            lVar12 = (long)(int)lVar12;
            lVar13 = 0;
            do {
              pcVar9 = m_00->cd_tree;
              pcVar9[lVar12].ctx = (int16)lVar13;
              pcVar9[lVar12].c.pid = (int)uVar18;
              ppVar14 = m->wpos_ci_lclist[lVar22][lVar13];
              if (ppVar14 != (ph_lc_t *)0x0) {
                uVar18 = (ulong)(int)uVar18;
                do {
                  pcVar9 = m_00->cd_tree;
                  pcVar9[uVar18].ctx = ppVar14->lc;
                  pcVar9[uVar18].c.pid = (int)uVar24;
                  ppVar17 = ppVar14->rclist;
                  if (ppVar17 != (ph_rc_t *)0x0) {
                    uVar24 = (ulong)(int)uVar24;
                    do {
                      pcVar9 = m_00->cd_tree;
                      pcVar9[uVar24].ctx = ppVar17->rc;
                      pcVar9[uVar24].n_down = 0;
                      pcVar9[uVar24].c = (anon_union_4_2_61eccf2c_for_c)ppVar17->pid;
                      piVar2 = &m_00->cd_tree[uVar18].n_down;
                      *piVar2 = *piVar2 + 1;
                      uVar24 = uVar24 + 1;
                      ppVar17 = ppVar17->next;
                    } while (ppVar17 != (ph_rc_s *)0x0);
                  }
                  if (m_00->cd_tree[uVar18].n_down == 0) {
                    m_00->cd_tree[uVar18].c.pid = -1;
                  }
                  piVar2 = &m_00->cd_tree[lVar12].n_down;
                  *piVar2 = *piVar2 + 1;
                  uVar18 = uVar18 + 1;
                  ppVar14 = ppVar14->next;
                } while (ppVar14 != (ph_lc_s *)0x0);
              }
              if (m_00->cd_tree[lVar12].n_down == 0) {
                m_00->cd_tree[lVar12].c.pid = -1;
              }
              lVar12 = lVar12 + 1;
              lVar13 = lVar13 + 1;
            } while (lVar13 < m->n_ciphone);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 4);
        mdef_free(m);
        m_00->alloc_mode = BIN_MDEF_FROM_TEXT;
        return m_00;
      }
      pcVar10 = "Number of phones exceeds limit: %d > %d\n";
      lVar12 = 0x5a;
      uVar19 = 0xff;
      goto LAB_0011fdff;
    }
    pcVar10 = "Number of senone sequences exceeds limit: %d > %d\n";
    lVar12 = 0x53;
  }
  else {
    pcVar10 = "Number of senones exceeds limit: %d > %d\n";
    lVar12 = 0x4d;
  }
  uVar19 = 0xffff;
LAB_0011fdff:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
          ,lVar12,pcVar10,(ulong)uVar23,uVar19);
  mdef_free(m);
  return (bin_mdef_t *)0x0;
}

Assistant:

bin_mdef_t *
bin_mdef_read_text(ps_config_t *config, const char *filename)
{
    bin_mdef_t *bmdef;
    mdef_t *mdef;
    int i, nodes, ci_idx, lc_idx, rc_idx;
    int nchars;

    (void)config;

    if ((mdef = mdef_init((char *) filename, TRUE)) == NULL)
        return NULL;

    /* Enforce some limits.  */
    if (mdef->n_sen > BAD_SENID) {
        E_ERROR("Number of senones exceeds limit: %d > %d\n",
                mdef->n_sen, BAD_SENID);
        mdef_free(mdef);
        return NULL;
    }
    if (mdef->n_sseq > BAD_SSID) {
        E_ERROR("Number of senone sequences exceeds limit: %d > %d\n",
                mdef->n_sseq, BAD_SSID);
        mdef_free(mdef);
        return NULL;
    }
    /* We use uint8 for ciphones */
    if (mdef->n_ciphone > 255) {
        E_ERROR("Number of phones exceeds limit: %d > %d\n",
                mdef->n_ciphone, 255);
        mdef_free(mdef);
        return NULL;
    }

    bmdef = ckd_calloc(1, sizeof(*bmdef));
    bmdef->refcnt = 1;

    /* Easy stuff.  The mdef.c code has done the heavy lifting for us. */
    bmdef->n_ciphone = mdef->n_ciphone;
    bmdef->n_phone = mdef->n_phone;
    bmdef->n_emit_state = mdef->n_emit_state;
    bmdef->n_ci_sen = mdef->n_ci_sen;
    bmdef->n_sen = mdef->n_sen;
    bmdef->n_tmat = mdef->n_tmat;
    bmdef->n_sseq = mdef->n_sseq;
    bmdef->sseq = mdef->sseq;
    bmdef->cd2cisen = mdef->cd2cisen;
    bmdef->sen2cimap = mdef->sen2cimap;
    bmdef->n_ctx = 3;           /* Triphones only. */
    bmdef->sil = mdef->sil;
    mdef->sseq = NULL;          /* We are taking over this one. */
    mdef->cd2cisen = NULL;      /* And this one. */
    mdef->sen2cimap = NULL;     /* And this one. */

    /* Get the phone names.  If they are not sorted
     * ASCII-betically then we are in a world of hurt and
     * therefore will simply refuse to continue. */
    bmdef->ciname = ckd_calloc(bmdef->n_ciphone, sizeof(*bmdef->ciname));
    nchars = 0;
    for (i = 0; i < bmdef->n_ciphone; ++i)
        nchars += strlen(mdef->ciphone[i].name) + 1;
    bmdef->ciname[0] = ckd_calloc(nchars, 1);
    strcpy(bmdef->ciname[0], mdef->ciphone[0].name);
    for (i = 1; i < bmdef->n_ciphone; ++i) {
        assert(i > 0); /* No reason to imagine it wouldn't be, but... */
        bmdef->ciname[i] =
            bmdef->ciname[i - 1] + strlen(bmdef->ciname[i - 1]) + 1;
        strcpy(bmdef->ciname[i], mdef->ciphone[i].name);
        if (strcmp(bmdef->ciname[i - 1], bmdef->ciname[i]) > 0) {
            /* FIXME: there should be a solution to this, actually. */
            E_ERROR("Phone names are not in sorted order, sorry.");
            bin_mdef_free(bmdef);
            mdef_free(mdef);
            return NULL;
        }
    }

    /* Copy over phone information. */
    bmdef->phone = ckd_calloc(bmdef->n_phone, sizeof(*bmdef->phone));
    for (i = 0; i < mdef->n_phone; ++i) {
        bmdef->phone[i].ssid = mdef->phone[i].ssid;
        bmdef->phone[i].tmat = mdef->phone[i].tmat;
        if (i < bmdef->n_ciphone) {
            bmdef->phone[i].info.ci.filler = mdef->ciphone[i].filler;
        }
        else {
            bmdef->phone[i].info.cd.wpos = mdef->phone[i].wpos;
            bmdef->phone[i].info.cd.ctx[0] = mdef->phone[i].ci;
            bmdef->phone[i].info.cd.ctx[1] = mdef->phone[i].lc;
            bmdef->phone[i].info.cd.ctx[2] = mdef->phone[i].rc;
        }
    }

    /* Walk the wpos_ci_lclist once to find the total number of
     * nodes and the starting locations for each level. */
    nodes = lc_idx = ci_idx = rc_idx = 0;
    for (i = 0; i < N_WORD_POSN; ++i) {
        int j;
        for (j = 0; j < mdef->n_ciphone; ++j) {
            ph_lc_t *lc;

            for (lc = mdef->wpos_ci_lclist[i][j]; lc; lc = lc->next) {
                ph_rc_t *rc;
                for (rc = lc->rclist; rc; rc = rc->next) {
                    ++nodes;    /* RC node */
                }
                ++nodes;        /* LC node */
                ++rc_idx;       /* Start of RC nodes (after LC nodes) */
            }
            ++nodes;            /* CI node */
            ++lc_idx;           /* Start of LC nodes (after CI nodes) */
            ++rc_idx;           /* Start of RC nodes (after CI and LC nodes) */
        }
        ++nodes;                /* wpos node */
        ++ci_idx;               /* Start of CI nodes (after wpos nodes) */
        ++lc_idx;               /* Start of LC nodes (after CI nodes) */
        ++rc_idx;               /* STart of RC nodes (after wpos, CI, and LC nodes) */
    }
    E_INFO("Allocating %d * %d bytes (%d KiB) for CD tree\n",
           nodes, sizeof(*bmdef->cd_tree), 
           nodes * sizeof(*bmdef->cd_tree) / 1024);
    bmdef->n_cd_tree = nodes;
    bmdef->cd_tree = ckd_calloc(nodes, sizeof(*bmdef->cd_tree));
    for (i = 0; i < N_WORD_POSN; ++i) {
        int j;

        bmdef->cd_tree[i].ctx = i;
        bmdef->cd_tree[i].n_down = mdef->n_ciphone;
        bmdef->cd_tree[i].c.down = ci_idx;
#if 0
        E_INFO("%d => %c (%d@%d)\n",
               i, (WPOS_NAME)[i],
               bmdef->cd_tree[i].n_down, bmdef->cd_tree[i].c.down);
#endif

        /* Now we can build the rest of the tree. */
        for (j = 0; j < mdef->n_ciphone; ++j) {
            ph_lc_t *lc;

            bmdef->cd_tree[ci_idx].ctx = j;
            bmdef->cd_tree[ci_idx].c.down = lc_idx;
            for (lc = mdef->wpos_ci_lclist[i][j]; lc; lc = lc->next) {
                ph_rc_t *rc;

                bmdef->cd_tree[lc_idx].ctx = lc->lc;
                bmdef->cd_tree[lc_idx].c.down = rc_idx;
                for (rc = lc->rclist; rc; rc = rc->next) {
                    bmdef->cd_tree[rc_idx].ctx = rc->rc;
                    bmdef->cd_tree[rc_idx].n_down = 0;
                    bmdef->cd_tree[rc_idx].c.pid = rc->pid;
#if 0
                    E_INFO("%d => %s %s %s %c (%d@%d)\n",
                           rc_idx,
                           bmdef->ciname[j],
                           bmdef->ciname[lc->lc],
                           bmdef->ciname[rc->rc],
                           (WPOS_NAME)[i],
                           bmdef->cd_tree[rc_idx].n_down,
                           bmdef->cd_tree[rc_idx].c.down);
#endif

                    ++bmdef->cd_tree[lc_idx].n_down;
                    ++rc_idx;
                }
                /* If there are no triphones here,
                 * this is considered a leafnode, so
                 * set the pid to -1. */
                if (bmdef->cd_tree[lc_idx].n_down == 0)
                    bmdef->cd_tree[lc_idx].c.pid = -1;
#if 0
                E_INFO("%d => %s %s %c (%d@%d)\n",
                       lc_idx,
                       bmdef->ciname[j],
                       bmdef->ciname[lc->lc],
                       (WPOS_NAME)[i],
                       bmdef->cd_tree[lc_idx].n_down,
                       bmdef->cd_tree[lc_idx].c.down);
#endif

                ++bmdef->cd_tree[ci_idx].n_down;
                ++lc_idx;
            }

            /* As above, so below. */
            if (bmdef->cd_tree[ci_idx].n_down == 0)
                bmdef->cd_tree[ci_idx].c.pid = -1;
#if 0
            E_INFO("%d => %d=%s (%d@%d)\n",
                   ci_idx, j, bmdef->ciname[j],
                   bmdef->cd_tree[ci_idx].n_down,
                   bmdef->cd_tree[ci_idx].c.down);
#endif

            ++ci_idx;
        }
    }

    mdef_free(mdef);

    bmdef->alloc_mode = BIN_MDEF_FROM_TEXT;
    return bmdef;
}